

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

Reference<std::allocator<absl::lts_20250127::status_internal::Payload>_> __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
::EmplaceBackSlow<absl::lts_20250127::status_internal::Payload>
          (Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
           *this,Payload *args)

{
  allocator<absl::lts_20250127::status_internal::Payload> *paVar1;
  SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_> requested_capacity_00;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> pPVar2;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> *ppPVar3;
  Allocation<std::allocator<absl::lts_20250127::status_internal::Payload>_> allocation;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> last_ptr;
  Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_> construct_data;
  SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_> requested_capacity;
  move_iterator<absl::lts_20250127::status_internal::Payload_*> local_50;
  IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_std::move_iterator<absl::lts_20250127::status_internal::Payload_*>_>
  local_48;
  IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_std::move_iterator<absl::lts_20250127::status_internal::Payload_*>_>
  move_values;
  AllocationTransaction<std::allocator<absl::lts_20250127::status_internal::Payload>_> allocation_tx
  ;
  StorageView<std::allocator<absl::lts_20250127::status_internal::Payload>_> storage_view;
  Payload *args_local;
  Storage<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
  *this_local;
  
  MakeStorageView((StorageView<std::allocator<absl::lts_20250127::status_internal::Payload>_> *)
                  &allocation_tx.capacity_,this);
  paVar1 = GetAllocator(this);
  AllocationTransaction<std::allocator<absl::lts_20250127::status_internal::Payload>_>::
  AllocationTransaction
            ((AllocationTransaction<std::allocator<absl::lts_20250127::status_internal::Payload>_> *
             )&move_values,paVar1);
  std::move_iterator<absl::lts_20250127::status_internal::Payload_*>::move_iterator
            (&local_50,(iterator_type)allocation_tx.capacity_);
  IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_std::move_iterator<absl::lts_20250127::status_internal::Payload_*>_>
  ::IteratorValueAdapter(&local_48,&local_50);
  requested_capacity_00 = NextCapacity(storage_view.size);
  pPVar2 = AllocationTransaction<std::allocator<absl::lts_20250127::status_internal::Payload>_>::
           Allocate((AllocationTransaction<std::allocator<absl::lts_20250127::status_internal::Payload>_>
                     *)&move_values,requested_capacity_00);
  paVar1 = GetAllocator(this);
  std::allocator_traits<std::allocator<absl::lts_20250127::status_internal::Payload>>::
  construct<absl::lts_20250127::status_internal::Payload,absl::lts_20250127::status_internal::Payload>
            (paVar1,pPVar2 + (long)storage_view.data,args);
  paVar1 = GetAllocator(this);
  ppPVar3 = AllocationTransaction<std::allocator<absl::lts_20250127::status_internal::Payload>_>::
            GetData((AllocationTransaction<std::allocator<absl::lts_20250127::status_internal::Payload>_>
                     *)&move_values);
  ConstructElements<std::allocator<absl::lts_20250127::status_internal::Payload>,absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,std::move_iterator<absl::lts_20250127::status_internal::Payload*>>>
            (paVar1,*ppPVar3,&local_48,
             (SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
             storage_view.data);
  paVar1 = GetAllocator(this);
  DestroyAdapter<std::allocator<absl::lts_20250127::status_internal::Payload>,_false>::
  DestroyElements(paVar1,(Pointer<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
                         allocation_tx.capacity_,
                  (SizeType<std::allocator<absl::lts_20250127::status_internal::Payload>_>)
                  storage_view.data);
  DeallocateIfAllocated(this);
  allocation = AllocationTransaction<std::allocator<absl::lts_20250127::status_internal::Payload>_>
               ::Release((AllocationTransaction<std::allocator<absl::lts_20250127::status_internal::Payload>_>
                          *)&move_values);
  SetAllocation(this,allocation);
  SetIsAllocated(this);
  AddSize(this,1);
  AllocationTransaction<std::allocator<absl::lts_20250127::status_internal::Payload>_>::
  ~AllocationTransaction
            ((AllocationTransaction<std::allocator<absl::lts_20250127::status_internal::Payload>_> *
             )&move_values);
  return pPVar2 + (long)storage_view.data;
}

Assistant:

auto Storage<T, N, A>::EmplaceBackSlow(Args&&... args) -> Reference<A> {
  StorageView<A> storage_view = MakeStorageView();
  AllocationTransaction<A> allocation_tx(GetAllocator());
  IteratorValueAdapter<A, MoveIterator<A>> move_values(
      MoveIterator<A>(storage_view.data));
  SizeType<A> requested_capacity = NextCapacity(storage_view.capacity);
  Pointer<A> construct_data = allocation_tx.Allocate(requested_capacity);
  Pointer<A> last_ptr = construct_data + storage_view.size;

  // Construct new element.
  AllocatorTraits<A>::construct(GetAllocator(), last_ptr,
                                std::forward<Args>(args)...);
  // Move elements from old backing store to new backing store.
  ABSL_INTERNAL_TRY {
    ConstructElements<A>(GetAllocator(), allocation_tx.GetData(), move_values,
                         storage_view.size);
  }